

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_column_writer.hpp
# Opt level: O1

void __thiscall
duckdb::StandardColumnWriter<duckdb::uhugeint_t,_double,_duckdb::ParquetUhugeintOperator>::
WriteVectorInternal<true>
          (StandardColumnWriter<duckdb::uhugeint_t,_double,_duckdb::ParquetUhugeintOperator> *this,
          WriteStream *temp_writer,ColumnWriterStatistics *stats,ColumnWriterPageState *page_state_p
          ,Vector *input_column,idx_t chunk_start,idx_t chunk_end)

{
  Vector *chunk_end_00;
  long lVar1;
  idx_t i;
  Allocator *pAVar2;
  long lVar3;
  idx_t iVar4;
  primitive_dictionary_entry_t *ppVar5;
  InternalException *this_00;
  Vector *mask;
  WriteStream *ser;
  uhugeint_t *value;
  idx_t r;
  idx_t iVar6;
  uint64_t *puVar7;
  uhugeint_t uVar8;
  uhugeint_t uVar9;
  uhugeint_t uVar10;
  uhugeint_t uVar11;
  uhugeint_t uVar12;
  double target_value;
  undefined1 *local_58 [2];
  undefined1 local_48 [16];
  StandardColumnWriter<duckdb::uhugeint_t,_double,_duckdb::ParquetUhugeintOperator> *local_38;
  
  mask = input_column;
  ser = (WriteStream *)chunk_start;
  local_38 = this;
  FlatVector::VerifyFlatVector(input_column);
  if (9 < *(uint *)&page_state_p[1]._vptr_ColumnWriterPageState) {
switchD_0025ed48_caseD_1:
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    local_58[0] = local_48;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"Unknown encoding","");
    duckdb::InternalException::InternalException(this_00,(string *)local_58);
    __cxa_throw(this_00,&InternalException::typeinfo,std::runtime_error::~runtime_error);
  }
  chunk_end_00 = input_column + 0x28;
  lVar1 = *(long *)(input_column + 0x20);
  switch(*(uint *)&page_state_p[1]._vptr_ColumnWriterPageState) {
  case 0:
    if (*(long *)chunk_end_00 == 0) {
      TemplatedWritePlain<duckdb::uhugeint_t,double,duckdb::ParquetUhugeintOperator,true>
                (input_column,(ColumnWriterStatistics *)chunk_start,chunk_end,(idx_t)temp_writer,
                 (ValidityMask *)mask,ser);
      return;
    }
    TemplatedWritePlain<duckdb::uhugeint_t,double,duckdb::ParquetUhugeintOperator,false>
              (input_column,(ColumnWriterStatistics *)chunk_start,chunk_end,(idx_t)chunk_end_00,
               (ValidityMask *)temp_writer,ser);
    return;
  default:
    goto switchD_0025ed48_caseD_1;
  case 5:
    iVar6 = chunk_start;
    if ((chunk_start < chunk_end) &&
       (*(char *)((long)&page_state_p[1]._vptr_ColumnWriterPageState + 4) == '\0')) {
      iVar4 = chunk_start;
      do {
        iVar6 = chunk_start;
        if ((*(long *)chunk_end_00 == 0) ||
           (iVar6 = iVar4,
           (*(ulong *)(*(long *)chunk_end_00 + (iVar4 >> 6) * 8) >> (iVar4 & 0x3f) & 1) != 0)) {
          local_58[0] = (undefined1 *)0x0;
          uVar11.upper = *(uint64_t *)(lVar1 + 8 + iVar6 * 0x10);
          uVar11.lower = *(uint64_t *)(lVar1 + iVar6 * 0x10);
          duckdb::Uhugeint::TryCast<double>(uVar11,(double *)local_58);
          DbpEncoder::BeginWrite<double>
                    ((DbpEncoder *)(page_state_p + 2),temp_writer,(double *)local_58);
          *(undefined1 *)((long)&page_state_p[1]._vptr_ColumnWriterPageState + 4) = 1;
          iVar6 = iVar6 + 1;
          break;
        }
        iVar4 = iVar4 + 1;
        iVar6 = chunk_end;
      } while (chunk_end != iVar4);
    }
    lVar3 = chunk_end - iVar6;
    if (iVar6 <= chunk_end && lVar3 != 0) {
      puVar7 = (uint64_t *)(iVar6 * 0x10 + lVar1 + 8);
      do {
        local_58[0] = (undefined1 *)0x0;
        uVar12.upper = *puVar7;
        uVar12.lower = puVar7[-1];
        duckdb::Uhugeint::TryCast<double>(uVar12,(double *)local_58);
        DbpEncoder::WriteValue<double>
                  ((DbpEncoder *)(page_state_p + 2),temp_writer,(double *)local_58);
        puVar7 = puVar7 + 2;
        lVar3 = lVar3 + -1;
      } while (lVar3 != 0);
    }
    break;
  case 6:
    iVar6 = chunk_start;
    if ((chunk_start < chunk_end) &&
       (*(char *)&page_state_p[0x908]._vptr_ColumnWriterPageState == '\0')) {
      iVar4 = chunk_start;
      do {
        iVar6 = chunk_start;
        if ((*(long *)chunk_end_00 == 0) ||
           (iVar6 = iVar4,
           (*(ulong *)(*(long *)chunk_end_00 + (iVar4 >> 6) * 8) >> (iVar4 & 0x3f) & 1) != 0)) {
          local_58[0] = (undefined1 *)0x0;
          uVar9.upper = *(uint64_t *)(lVar1 + 8 + iVar6 * 0x10);
          uVar9.lower = *(uint64_t *)(lVar1 + iVar6 * 0x10);
          duckdb::Uhugeint::TryCast<double>(uVar9,(double *)local_58);
          pAVar2 = (Allocator *)
                   duckdb::BufferAllocator::Get
                             (((local_38->super_PrimitiveColumnWriter).super_ColumnWriter.writer)->
                              context);
          DlbaEncoder::BeginWrite<double>
                    ((DlbaEncoder *)(page_state_p + 0x909),pAVar2,temp_writer,(double *)local_58);
          *(undefined1 *)&page_state_p[0x908]._vptr_ColumnWriterPageState = 1;
          iVar6 = iVar6 + 1;
          break;
        }
        iVar4 = iVar4 + 1;
        iVar6 = chunk_end;
      } while (chunk_end != iVar4);
    }
    lVar3 = chunk_end - iVar6;
    if (iVar6 <= chunk_end && lVar3 != 0) {
      puVar7 = (uint64_t *)(iVar6 * 0x10 + lVar1 + 8);
      do {
        local_58[0] = (undefined1 *)0x0;
        uVar10.upper = *puVar7;
        uVar10.lower = puVar7[-1];
        duckdb::Uhugeint::TryCast<double>(uVar10,(double *)local_58);
        DlbaEncoder::WriteValue<double>
                  ((DlbaEncoder *)(page_state_p + 0x909),temp_writer,(double *)local_58);
        puVar7 = puVar7 + 2;
        lVar3 = lVar3 + -1;
      } while (lVar3 != 0);
    }
    break;
  case 8:
    iVar6 = chunk_start;
    if ((chunk_start < chunk_end) &&
       (*(char *)&page_state_p[0x121c]._vptr_ColumnWriterPageState == '\0')) {
      iVar4 = chunk_start;
      do {
        iVar6 = chunk_start;
        if ((*(long *)chunk_end_00 == 0) ||
           (iVar6 = iVar4,
           (*(ulong *)(*(long *)chunk_end_00 + (iVar4 >> 6) * 8) >> (iVar4 & 0x3f) & 1) != 0)) {
          local_58[0] = (undefined1 *)
                        CONCAT71(local_58[0]._1_7_,
                                 *(undefined1 *)
                                  ((long)&page_state_p[0x121c]._vptr_ColumnWriterPageState + 4));
          (*(code *)**(undefined8 **)temp_writer)(temp_writer,local_58,1);
          page_state_p[0x121f]._vptr_ColumnWriterPageState = (_func_int **)0x0;
          page_state_p[0x1320]._vptr_ColumnWriterPageState = (_func_int **)0x0;
          *(undefined1 *)&page_state_p[0x121c]._vptr_ColumnWriterPageState = 1;
          break;
        }
        iVar4 = iVar4 + 1;
        iVar6 = chunk_end;
      } while (chunk_end != iVar4);
    }
    lVar3 = chunk_end - iVar6;
    if (iVar6 <= chunk_end && lVar3 != 0) {
      value = (uhugeint_t *)(lVar1 + iVar6 * 0x10);
      do {
        ppVar5 = PrimitiveDictionary<duckdb::uhugeint_t,_double,_duckdb::ParquetUhugeintOperator>::
                 Lookup((PrimitiveDictionary<duckdb::uhugeint_t,_double,_duckdb::ParquetUhugeintOperator>
                         *)page_state_p[0x121b]._vptr_ColumnWriterPageState,value);
        local_58[0] = (undefined1 *)CONCAT44(local_58[0]._4_4_,ppVar5->index);
        RleBpEncoder::WriteValue
                  ((RleBpEncoder *)(page_state_p + 0x121d),temp_writer,(uint32_t *)local_58);
        value = value + 1;
        lVar3 = lVar3 + -1;
      } while (lVar3 != 0);
    }
    break;
  case 9:
    if (*(char *)&page_state_p[0x1214]._vptr_ColumnWriterPageState == '\x01') {
      pAVar2 = (Allocator *)
               duckdb::BufferAllocator::Get
                         (((local_38->super_PrimitiveColumnWriter).super_ColumnWriter.writer)->
                          context);
      BssEncoder::BeginWrite((BssEncoder *)(page_state_p + 0x1215),pAVar2);
      *(undefined1 *)&page_state_p[0x1214]._vptr_ColumnWriterPageState = 1;
    }
    if (chunk_start < chunk_end) {
      do {
        local_58[0] = (undefined1 *)0x0;
        uVar8.upper = *(uint64_t *)(lVar1 + 8 + chunk_start * 0x10);
        uVar8.lower = *(uint64_t *)(lVar1 + chunk_start * 0x10);
        duckdb::Uhugeint::TryCast<double>(uVar8,(double *)local_58);
        lVar3 = 0;
        do {
          *(undefined1 *)
           ((long)page_state_p[0x1217]._vptr_ColumnWriterPageState +
           (long)((long)page_state_p[0x1215]._vptr_ColumnWriterPageState * lVar3 +
                 (long)page_state_p[0x1219]._vptr_ColumnWriterPageState)) =
               *(undefined1 *)((long)local_58 + lVar3);
          lVar3 = lVar3 + 1;
        } while (lVar3 != 8);
        page_state_p[0x1217]._vptr_ColumnWriterPageState =
             (_func_int **)((long)page_state_p[0x1217]._vptr_ColumnWriterPageState + 1);
        chunk_start = chunk_start + 1;
      } while (chunk_start != chunk_end);
    }
  }
  return;
}

Assistant:

void WriteVectorInternal(WriteStream &temp_writer, ColumnWriterStatistics *stats,
	                         ColumnWriterPageState *page_state_p, Vector &input_column, idx_t chunk_start,
	                         idx_t chunk_end) {
		auto &page_state = page_state_p->Cast<StandardWriterPageState<SRC, TGT, OP>>();

		const auto &mask = FlatVector::Validity(input_column);
		const auto *data_ptr = FlatVector::GetData<SRC>(input_column);

		switch (page_state.encoding) {
		case duckdb_parquet::Encoding::RLE_DICTIONARY: {
			idx_t r = chunk_start;
			if (!page_state.dict_written_value) {
				// find first non-null value
				for (; r < chunk_end; r++) {
					if (!mask.RowIsValid(r)) {
						continue;
					}
					// write the bit-width as a one-byte entry and initialize writer
					temp_writer.Write<uint8_t>(page_state.dict_bit_width);
					page_state.dict_encoder.BeginWrite();
					page_state.dict_written_value = true;
					break;
				}
			}

			for (; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const auto &src_value = data_ptr[r];
				const auto value_index = page_state.dictionary.GetIndex(src_value);
				page_state.dict_encoder.WriteValue(temp_writer, value_index);
			}
			break;
		}
		case duckdb_parquet::Encoding::DELTA_BINARY_PACKED: {
			idx_t r = chunk_start;
			if (!page_state.dbp_initialized) {
				// find first non-null value
				for (; r < chunk_end; r++) {
					if (!mask.RowIsValid(r)) {
						continue;
					}
					const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
					OP::template HandleStats<SRC, TGT>(stats, target_value);
					page_state.dbp_encoder.BeginWrite(temp_writer, target_value);
					page_state.dbp_initialized = true;
					r++; // skip over
					break;
				}
			}

			for (; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
				OP::template HandleStats<SRC, TGT>(stats, target_value);
				page_state.dbp_encoder.WriteValue(temp_writer, target_value);
			}
			break;
		}
		case duckdb_parquet::Encoding::DELTA_LENGTH_BYTE_ARRAY: {
			idx_t r = chunk_start;
			if (!page_state.dlba_initialized) {
				// find first non-null value
				for (; r < chunk_end; r++) {
					if (!mask.RowIsValid(r)) {
						continue;
					}
					const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
					OP::template HandleStats<SRC, TGT>(stats, target_value);
					page_state.dlba_encoder.BeginWrite(BufferAllocator::Get(writer.GetContext()), temp_writer,
					                                   target_value);
					page_state.dlba_initialized = true;
					r++; // skip over
					break;
				}
			}

			for (; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
				OP::template HandleStats<SRC, TGT>(stats, target_value);
				page_state.dlba_encoder.WriteValue(temp_writer, target_value);
			}
			break;
		}
		case duckdb_parquet::Encoding::BYTE_STREAM_SPLIT: {
			if (page_state.bss_initialized) {
				page_state.bss_encoder.BeginWrite(BufferAllocator::Get(writer.GetContext()));
				page_state.bss_initialized = true;
			}
			for (idx_t r = chunk_start; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
				OP::template HandleStats<SRC, TGT>(stats, target_value);
				page_state.bss_encoder.WriteValue(target_value);
			}
			break;
		}
		case duckdb_parquet::Encoding::PLAIN: {
			D_ASSERT(page_state.encoding == duckdb_parquet::Encoding::PLAIN);
			if (mask.AllValid()) {
				TemplatedWritePlain<SRC, TGT, OP, true>(input_column, stats, chunk_start, chunk_end, mask, temp_writer);
			} else {
				TemplatedWritePlain<SRC, TGT, OP, false>(input_column, stats, chunk_start, chunk_end, mask,
				                                         temp_writer);
			}
			break;
		}
		default:
			throw InternalException("Unknown encoding");
		}
	}